

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_u32.cpp
# Opt level: O0

void T_UConverter_toUnicode_UTF32_LE_OFFSET_LOGIC(UConverterToUnicodeArgs *args,UErrorCode *err)

{
  UChar *pUVar1;
  UChar *pUVar2;
  UConverter *pUVar3;
  UBool UVar4;
  UChar UVar5;
  UChar *pUVar6;
  int *piVar7;
  int local_54;
  uint local_50;
  int32_t offsetNum;
  uint32_t i;
  uint32_t ch;
  uchar *toUBytes;
  UChar *targetLimit;
  uchar *sourceLimit;
  int32_t *myOffsets;
  UChar *myTarget;
  uchar *mySource;
  UErrorCode *err_local;
  UConverterToUnicodeArgs *args_local;
  
  myTarget = (UChar *)args->source;
  myOffsets = (int32_t *)args->target;
  sourceLimit = (uchar *)args->offsets;
  pUVar1 = (UChar *)args->sourceLimit;
  pUVar2 = args->targetLimit;
  pUVar3 = args->converter;
  local_54 = 0;
  if (args->converter->toULength < '\x01') goto LAB_00388abd;
  if (pUVar2 <= myOffsets) goto LAB_00388abd;
  local_50 = (uint)args->converter->toULength;
  args->converter->toULength = '\0';
  offsetNum = args->converter->toUnicodeStatus - 1;
  args->converter->toUnicodeStatus = 0;
  do {
    while (local_50 < 4) {
      if (pUVar1 <= myTarget) {
        args->converter->toUnicodeStatus = offsetNum + 1;
        args->converter->toULength = (int8_t)local_50;
LAB_00388ca3:
        if (((myTarget < pUVar1) && (pUVar2 <= myOffsets)) &&
           (UVar4 = U_SUCCESS(*err), UVar4 != '\0')) {
          *err = U_BUFFER_OVERFLOW_ERROR;
        }
        args->target = (UChar *)myOffsets;
        args->source = (char *)myTarget;
        args->offsets = (int32_t *)sourceLimit;
        return;
      }
      offsetNum = (uint)(byte)*myTarget << ((byte)(local_50 << 3) & 0x1f) | offsetNum;
      pUVar3->toUBytes[local_50] = (uint8_t)*myTarget;
      local_50 = local_50 + 1;
      myTarget = (UChar *)((long)myTarget + 1);
    }
    if ((0x10ffff < (uint)offsetNum) || ((offsetNum & 0xfffff800U) == 0xd800)) {
      args->converter->toULength = (int8_t)local_50;
      *err = U_ILLEGAL_CHAR_FOUND;
      goto LAB_00388ca3;
    }
    if ((uint)offsetNum < 0x10000) {
      *(ushort *)myOffsets = (ushort)offsetNum;
      *(int *)sourceLimit = local_54;
      sourceLimit = sourceLimit + 4;
      myOffsets = (int32_t *)((long)myOffsets + 2);
    }
    else {
      pUVar6 = (UChar *)((long)myOffsets + 2);
      *(short *)myOffsets = (short)((uint)offsetNum >> 10) + -0x2840;
      piVar7 = (int *)(sourceLimit + 4);
      *(int *)sourceLimit = local_54;
      UVar5 = (ushort)offsetNum & 0x3ff | 0xdc00;
      if (pUVar2 <= pUVar6) {
        args->converter->UCharErrorBuffer[0] = UVar5;
        args->converter->UCharErrorBufferLength = '\x01';
        *err = U_BUFFER_OVERFLOW_ERROR;
        sourceLimit = (uchar *)piVar7;
        myOffsets = (int32_t *)pUVar6;
        goto LAB_00388ca3;
      }
      myOffsets = myOffsets + 1;
      *pUVar6 = UVar5;
      sourceLimit = sourceLimit + 8;
      *piVar7 = local_54;
    }
    local_54 = local_50 + local_54;
LAB_00388abd:
    if (pUVar1 <= myTarget || pUVar2 <= myOffsets) goto LAB_00388ca3;
    local_50 = 0;
    offsetNum = 0;
  } while( true );
}

Assistant:

static void U_CALLCONV
T_UConverter_toUnicode_UTF32_LE_OFFSET_LOGIC(UConverterToUnicodeArgs * args,
                                             UErrorCode * err)
{
    const unsigned char *mySource = (unsigned char *) args->source;
    UChar *myTarget = args->target;
    int32_t *myOffsets = args->offsets;
    const unsigned char *sourceLimit = (unsigned char *) args->sourceLimit;
    const UChar *targetLimit = args->targetLimit;
    unsigned char *toUBytes = args->converter->toUBytes;
    uint32_t ch, i;
    int32_t offsetNum = 0;

    /* Restore state of current sequence */
    if (args->converter->toULength > 0 && myTarget < targetLimit)
    {
        i = args->converter->toULength;       /* restore # of bytes consumed */
        args->converter->toULength = 0;

        /* Stores the previously calculated ch from a previous call*/
        ch = args->converter->toUnicodeStatus - 1;
        args->converter->toUnicodeStatus = 0;
        goto morebytes;
    }

    while (mySource < sourceLimit && myTarget < targetLimit)
    {
        i = 0;
        ch = 0;
morebytes:
        while (i < sizeof(uint32_t))
        {
            if (mySource < sourceLimit)
            {
                ch |= ((uint8_t)(*mySource)) << (i * 8);
                toUBytes[i++] = (char) *(mySource++);
            }
            else
            {
                /* stores a partially calculated target*/
                /* + 1 to make 0 a valid character */
                args->converter->toUnicodeStatus = ch + 1;
                args->converter->toULength = (int8_t) i;
                goto donefornow;
            }
        }

        if (ch <= MAXIMUM_UTF && !U_IS_SURROGATE(ch))
        {
            /* Normal valid byte when the loop has not prematurely terminated (i < inBytes) */
            if (ch <= MAXIMUM_UCS2) 
            {
                /* fits in 16 bits */
                *(myTarget++) = (UChar) ch;
                *(myOffsets++) = offsetNum;
            }
            else {
                /* write out the surrogates */
                *(myTarget++) = U16_LEAD(ch);
                *(myOffsets++) = offsetNum;
                ch = U16_TRAIL(ch);
                if (myTarget < targetLimit)
                {
                    *(myTarget++) = (UChar)ch;
                    *(myOffsets++) = offsetNum;
                }
                else
                {
                    /* Put in overflow buffer (not handled here) */
                    args->converter->UCharErrorBuffer[0] = (UChar) ch;
                    args->converter->UCharErrorBufferLength = 1;
                    *err = U_BUFFER_OVERFLOW_ERROR;
                    break;
                }
            }
        }
        else
        {
            args->converter->toULength = (int8_t)i;
            *err = U_ILLEGAL_CHAR_FOUND;
            break;
        }
        offsetNum += i;
    }

donefornow:
    if (mySource < sourceLimit && myTarget >= targetLimit && U_SUCCESS(*err))
    {
        /* End of target buffer */
        *err = U_BUFFER_OVERFLOW_ERROR;
    }

    args->target = myTarget;
    args->source = (const char *) mySource;
    args->offsets = myOffsets;
}